

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionalityClauseContainer.cpp
# Opt level: O1

void __thiscall
Saturation::ExtensionalityClauseContainer::print(ExtensionalityClauseContainer *this,ostream *out)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  List<Saturation::ExtensionalityClause> *pLVar4;
  ExtensionalityClause c;
  string local_a8;
  string local_88;
  Clause *local_68;
  Literal *pLStack_60;
  TermList local_58 [2];
  Iterator local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"#####################",0x15);
  cVar1 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  local_48._base._next = (this->_clausesBySort)._entries;
  local_48._base._last = (this->_clausesBySort)._afterLast;
  local_48._base._timestamp = (this->_clausesBySort)._timestamp;
  bVar2 = ::Lib::
          DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
          ::Iterator::hasNext(&local_48);
  if (bVar2) {
    do {
      pLVar4 = (local_48._base._next)->_val;
      local_48._base._next = local_48._base._next + 1;
      while (pLVar4 != (List<Saturation::ExtensionalityClause> *)0x0) {
        local_58[0]._content = (pLVar4->_head).sort._content;
        local_68 = (pLVar4->_head).clause;
        pLStack_60 = (pLVar4->_head).literal;
        pLVar4 = pLVar4->_tail;
        Kernel::Clause::toString_abi_cxx11_(&local_88,local_68);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_88._M_dataplus._M_p,local_88._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        poVar3 = (ostream *)std::ostream::flush();
        Kernel::Literal::toString_abi_cxx11_(&local_a8,pLStack_60);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_a8._M_dataplus._M_p,local_a8._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        poVar3 = (ostream *)std::ostream::flush();
        poVar3 = Kernel::operator<<(poVar3,local_58);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
      bVar2 = ::Lib::
              DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::Iterator::hasNext(&local_48);
    } while (bVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"#####################",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void ExtensionalityClauseContainer::print (std::ostream& out) {
  out << "#####################" << endl;

  ClausesBySort::Iterator cbs(_clausesBySort);

  while(cbs.hasNext()){
    ExtensionalityClauseList* l = cbs.next();
    ExtensionalityClauseList::Iterator it(l);
    while(it.hasNext()) {
      ExtensionalityClause c = it.next();
      out << c.clause->toString() << endl
          << c.literal->toString() << endl
          << c.sort << endl;
    }
  }
  
  out << "#####################" << endl;
}